

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O3

Reals __thiscall
Omega_h::get_curv_edge_curvatures_dim<2>
          (Omega_h *this,Mesh *mesh,LOs *curv_edge2edge,Reals *curv_edge_tangents,
          LOs *curv_vert2vert,Reals *curv_vert_tangents)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Alloc *pAVar3;
  Mesh *pMVar4;
  LO LVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar6;
  size_t sVar7;
  Reals RVar8;
  Write<double> curv_edges2curvature_w;
  Reals curv_edges2curvature;
  Reals coords;
  Read<signed_char> ev_flips;
  LOs edges2verts;
  type f;
  LOs edge2curv_edge;
  LOs vert2curv_vert;
  Adj curv_verts2edges;
  Adj verts2edges;
  Write<double> local_270;
  Omega_h *local_260;
  Omega_h *local_258;
  LOs local_250;
  LOs local_240;
  LOs local_230;
  LOs local_220;
  Alloc *local_210;
  void *local_208;
  Write<double> local_200;
  Read<signed_char> local_1f0;
  Alloc *local_1e0;
  element_type *local_1d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0;
  pointer local_1c8;
  Alloc *local_1c0;
  element_type *local_1b8;
  type local_1b0;
  Mesh *local_130;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_128;
  LOs local_120;
  Adj local_110;
  Alloc *local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  Alloc *local_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  Adj local_c0;
  Adj local_90;
  Adj local_60;
  
  local_220.write_.shared_alloc_.alloc = (curv_vert2vert->write_).shared_alloc_.alloc;
  if (((ulong)local_220.write_.shared_alloc_.alloc & 7) == 0 &&
      local_220.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_220.write_.shared_alloc_.alloc =
           (Alloc *)((local_220.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_220.write_.shared_alloc_.alloc)->use_count =
           (local_220.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_220.write_.shared_alloc_.direct_ptr = (curv_vert2vert->write_).shared_alloc_.direct_ptr;
  local_130 = (Mesh *)this;
  local_128._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)curv_vert_tangents;
  LVar5 = Mesh::nverts(mesh);
  invert_injective_map((Omega_h *)&local_d0,&local_220,LVar5);
  pAVar3 = local_220.write_.shared_alloc_.alloc;
  if (((ulong)local_220.write_.shared_alloc_.alloc & 7) == 0 &&
      local_220.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_220.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_220.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_230.write_.shared_alloc_.alloc = (curv_edge2edge->write_).shared_alloc_.alloc;
  if (((ulong)local_230.write_.shared_alloc_.alloc & 7) == 0 &&
      local_230.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_230.write_.shared_alloc_.alloc =
           (Alloc *)((local_230.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_230.write_.shared_alloc_.alloc)->use_count =
           (local_230.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_230.write_.shared_alloc_.direct_ptr = (curv_edge2edge->write_).shared_alloc_.direct_ptr;
  local_258 = (Omega_h *)&local_d0;
  LVar5 = Mesh::nedges(mesh);
  local_260 = (Omega_h *)&local_e0;
  invert_injective_map(local_260,&local_230,LVar5);
  pAVar3 = local_230.write_.shared_alloc_.alloc;
  if (((ulong)local_230.write_.shared_alloc_.alloc & 7) == 0 &&
      local_230.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_230.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_230.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  Mesh::ask_verts_of((Mesh *)&local_1c0,(Int)mesh);
  pAVar3 = (curv_edge2edge->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    sVar7 = pAVar3->size;
  }
  else {
    sVar7 = (ulong)pAVar3 >> 3;
  }
  local_1b0.curv_edge2edge.write_.shared_alloc_.alloc = (Alloc *)&local_1b0.curv_edge_tangents;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"");
  LVar5 = (LO)(sVar7 >> 2);
  Write<double>::Write(&local_270,LVar5,(string *)&local_1b0);
  if (local_1b0.curv_edge2edge.write_.shared_alloc_.alloc != (Alloc *)&local_1b0.curv_edge_tangents)
  {
    operator_delete(local_1b0.curv_edge2edge.write_.shared_alloc_.alloc,
                    (ulong)((long)&(local_1b0.curv_edge_tangents.write_.shared_alloc_.alloc)->size +
                           1));
  }
  Mesh::ask_up(&local_60,mesh,0,1);
  local_240.write_.shared_alloc_.alloc = (curv_vert2vert->write_).shared_alloc_.alloc;
  if (((ulong)local_240.write_.shared_alloc_.alloc & 7) == 0 &&
      local_240.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_240.write_.shared_alloc_.alloc =
           (Alloc *)((local_240.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_240.write_.shared_alloc_.alloc)->use_count =
           (local_240.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_240.write_.shared_alloc_.direct_ptr = (curv_vert2vert->write_).shared_alloc_.direct_ptr;
  local_c0.super_Graph.a2ab.write_.shared_alloc_.alloc =
       local_60.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c0.super_Graph.a2ab.write_.shared_alloc_.alloc =
           (Alloc *)((long)(((Graph *)&(local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->size)
                           ->a2ab).write_.shared_alloc_.alloc * 8 + 1);
    }
    else {
      (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_c0.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
       local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_c0.super_Graph.ab2b.write_.shared_alloc_.alloc =
       local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c0.super_Graph.ab2b.write_.shared_alloc_.alloc =
           (Alloc *)((long)(((Graph *)&(local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size)
                           ->a2ab).write_.shared_alloc_.alloc * 8 + 1);
    }
    else {
      (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_c0.super_Graph.ab2b.write_.shared_alloc_.direct_ptr =
       local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_c0.codes.write_.shared_alloc_.alloc = local_60.codes.write_.shared_alloc_.alloc;
  if (((ulong)local_60.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c0.codes.write_.shared_alloc_.alloc =
           (Alloc *)((long)(((Graph *)&(local_60.codes.write_.shared_alloc_.alloc)->size)->a2ab).
                           write_.shared_alloc_.alloc * 8 + 1);
    }
    else {
      (local_60.codes.write_.shared_alloc_.alloc)->use_count =
           (local_60.codes.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_c0.codes.write_.shared_alloc_.direct_ptr = local_60.codes.write_.shared_alloc_.direct_ptr;
  unmap_adjacency(&local_90,&local_240,&local_c0);
  Adj::~Adj(&local_c0);
  pAVar3 = local_240.write_.shared_alloc_.alloc;
  if (((ulong)local_240.write_.shared_alloc_.alloc & 7) == 0 &&
      local_240.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_240.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_240.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_110.super_Graph.a2ab.write_.shared_alloc_.alloc =
       local_90.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_90.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_110.super_Graph.a2ab.write_.shared_alloc_.alloc =
           (Alloc *)((long)(((Graph *)&(local_90.super_Graph.a2ab.write_.shared_alloc_.alloc)->size)
                           ->a2ab).write_.shared_alloc_.alloc * 8 + 1);
    }
    else {
      (local_90.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_90.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_110.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
       local_90.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_110.super_Graph.ab2b.write_.shared_alloc_.alloc =
       local_90.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_90.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_110.super_Graph.ab2b.write_.shared_alloc_.alloc =
           (Alloc *)((long)(((Graph *)&(local_90.super_Graph.ab2b.write_.shared_alloc_.alloc)->size)
                           ->a2ab).write_.shared_alloc_.alloc * 8 + 1);
    }
    else {
      (local_90.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_90.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_110.super_Graph.ab2b.write_.shared_alloc_.direct_ptr =
       local_90.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_110.codes.write_.shared_alloc_.alloc = local_90.codes.write_.shared_alloc_.alloc;
  if (((ulong)local_90.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_110.codes.write_.shared_alloc_.alloc =
           (Alloc *)((long)(((Graph *)&(local_90.codes.write_.shared_alloc_.alloc)->size)->a2ab).
                           write_.shared_alloc_.alloc * 8 + 1);
    }
    else {
      (local_90.codes.write_.shared_alloc_.alloc)->use_count =
           (local_90.codes.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_110.codes.write_.shared_alloc_.direct_ptr = local_90.codes.write_.shared_alloc_.direct_ptr;
  local_120.write_.shared_alloc_.alloc = local_e0;
  if (((ulong)local_e0 & 7) == 0 && local_e0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_120.write_.shared_alloc_.alloc = (Alloc *)(local_e0->size * 8 + 1);
    }
    else {
      local_e0->use_count = local_e0->use_count + 1;
    }
  }
  pAVar3 = local_120.write_.shared_alloc_.alloc;
  local_120.write_.shared_alloc_.direct_ptr = local_d8._M_pi;
  get_curv_edge_vert_flips((Omega_h *)&local_1d0,mesh,&local_110,&local_120);
  if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
    piVar1 = &pAVar3->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar3);
      operator_delete(pAVar3,0x48);
    }
  }
  Adj::~Adj(&local_110);
  Mesh::coords((Mesh *)&local_1e0);
  local_1b0.curv_edge2edge.write_.shared_alloc_.alloc = (curv_edge2edge->write_).shared_alloc_.alloc
  ;
  if (((ulong)local_1b0.curv_edge2edge.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1b0.curv_edge2edge.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b0.curv_edge2edge.write_.shared_alloc_.alloc =
           (Alloc *)((local_1b0.curv_edge2edge.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1b0.curv_edge2edge.write_.shared_alloc_.alloc)->use_count =
           (local_1b0.curv_edge2edge.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1b0.curv_edge2edge.write_.shared_alloc_.direct_ptr =
       (curv_edge2edge->write_).shared_alloc_.direct_ptr;
  local_1b0.curv_edge_tangents.write_.shared_alloc_.alloc =
       (curv_edge_tangents->write_).shared_alloc_.alloc;
  if (((ulong)local_1b0.curv_edge_tangents.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1b0.curv_edge_tangents.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b0.curv_edge_tangents.write_.shared_alloc_.alloc =
           (Alloc *)((local_1b0.curv_edge_tangents.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1b0.curv_edge_tangents.write_.shared_alloc_.alloc)->use_count =
           (local_1b0.curv_edge_tangents.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1b0.curv_edge_tangents.write_.shared_alloc_.direct_ptr =
       (curv_edge_tangents->write_).shared_alloc_.direct_ptr;
  local_1b0.edges2verts.write_.shared_alloc_.alloc = local_1c0;
  if (((ulong)local_1c0 & 7) == 0 && local_1c0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b0.edges2verts.write_.shared_alloc_.alloc = (Alloc *)(local_1c0->size * 8 + 1);
    }
    else {
      local_1c0->use_count = local_1c0->use_count + 1;
    }
  }
  local_1b0.edges2verts.write_.shared_alloc_.direct_ptr = local_1b8;
  local_1b0.vert2curv_vert.write_.shared_alloc_.alloc = local_d0;
  if (((ulong)local_d0 & 7) == 0 && local_d0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b0.vert2curv_vert.write_.shared_alloc_.alloc = (Alloc *)(local_d0->size * 8 + 1);
    }
    else {
      local_d0->use_count = local_d0->use_count + 1;
    }
  }
  local_1b0.vert2curv_vert.write_.shared_alloc_.direct_ptr = local_c8._M_pi;
  local_1b0.curv_vert_tangents.write_.shared_alloc_.alloc =
       (((Write<double> *)&(local_128._M_pi)->_vptr__Sp_counted_base)->shared_alloc_).alloc;
  if (((ulong)local_1b0.curv_vert_tangents.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1b0.curv_vert_tangents.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b0.curv_vert_tangents.write_.shared_alloc_.alloc =
           (Alloc *)((local_1b0.curv_vert_tangents.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1b0.curv_vert_tangents.write_.shared_alloc_.alloc)->use_count =
           (local_1b0.curv_vert_tangents.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1b0.curv_vert_tangents.write_.shared_alloc_.direct_ptr =
       *(void **)&(local_128._M_pi)->_M_use_count;
  local_1b0.ev_flips.write_.shared_alloc_.alloc = (Alloc *)local_1d0._M_pi;
  if (((ulong)local_1d0._M_pi & 7) == 0 && (Alloc *)local_1d0._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b0.ev_flips.write_.shared_alloc_.alloc =
           (Alloc *)((long)(local_1d0._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_1d0._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_1d0._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_1b0.ev_flips.write_.shared_alloc_.direct_ptr = local_1c8;
  local_1b0.coords.write_.shared_alloc_.alloc = local_1e0;
  if (((ulong)local_1e0 & 7) == 0 && local_1e0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b0.coords.write_.shared_alloc_.alloc = (Alloc *)(local_1e0->size * 8 + 1);
    }
    else {
      local_1e0->use_count = local_1e0->use_count + 1;
    }
  }
  local_1b0.coords.write_.shared_alloc_.direct_ptr = local_1d8;
  local_1b0.curv_edges2curvature_w.shared_alloc_.alloc = local_270.shared_alloc_.alloc;
  if (((ulong)local_270.shared_alloc_.alloc & 7) == 0 &&
      local_270.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b0.curv_edges2curvature_w.shared_alloc_.alloc =
           (Alloc *)((local_270.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_270.shared_alloc_.alloc)->use_count = (local_270.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1b0.curv_edges2curvature_w.shared_alloc_.direct_ptr = local_270.shared_alloc_.direct_ptr;
  parallel_for<Omega_h::get_curv_edge_curvatures_dim<2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>,Omega_h::Read<int>,Omega_h::Read<double>)::_lambda(int)_1_>
            (LVar5,&local_1b0,"get_curv_edge_curvatures");
  local_200.shared_alloc_.alloc = local_270.shared_alloc_.alloc;
  if (((ulong)local_270.shared_alloc_.alloc & 7) == 0 &&
      local_270.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_200.shared_alloc_.alloc = (Alloc *)((local_270.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_270.shared_alloc_.alloc)->use_count = (local_270.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_200.shared_alloc_.direct_ptr = local_270.shared_alloc_.direct_ptr;
  Read<double>::Read(&local_1f0,&local_200);
  pAVar3 = local_200.shared_alloc_.alloc;
  if (((ulong)local_200.shared_alloc_.alloc & 7) == 0 &&
      local_200.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_200.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_200.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  pMVar4 = local_130;
  local_250.write_.shared_alloc_.alloc = local_1f0.write_.shared_alloc_.alloc;
  if (((ulong)local_1f0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1f0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_250.write_.shared_alloc_.alloc =
           (Alloc *)((local_1f0.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1f0.write_.shared_alloc_.alloc)->use_count =
           (local_1f0.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_250.write_.shared_alloc_.direct_ptr = local_1f0.write_.shared_alloc_.direct_ptr;
  local_210 = (curv_edge2edge->write_).shared_alloc_.alloc;
  if (((ulong)local_210 & 7) == 0 && local_210 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_210 = (Alloc *)(local_210->size * 8 + 1);
    }
    else {
      local_210->use_count = local_210->use_count + 1;
    }
  }
  local_208 = (curv_edge2edge->write_).shared_alloc_.direct_ptr;
  Mesh::sync_subset_array<double>
            (local_130,(Int)mesh,(Read<double> *)0x1,&local_250,0.0,(Int)&local_210);
  pAVar3 = local_210;
  if (((ulong)local_210 & 7) == 0 && local_210 != (Alloc *)0x0) {
    piVar1 = &local_210->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_210);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_250.write_.shared_alloc_.alloc;
  if (((ulong)local_250.write_.shared_alloc_.alloc & 7) == 0 &&
      local_250.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_250.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_250.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  if (((ulong)local_1f0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1f0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1f0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1f0.write_.shared_alloc_.alloc);
      operator_delete(local_1f0.write_.shared_alloc_.alloc,0x48);
    }
  }
  get_curv_edge_curvatures_dim<2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>,Omega_h::Read<int>,Omega_h::Read<double>)
  ::{lambda(int)#1}::~Mesh((_lambda_int__1_ *)&local_1b0);
  if (((ulong)local_1e0 & 7) == 0 && local_1e0 != (Alloc *)0x0) {
    piVar1 = &local_1e0->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1e0);
      operator_delete(local_1e0,0x48);
    }
  }
  if (((ulong)local_1d0._M_pi & 7) == 0 && (Alloc *)local_1d0._M_pi != (Alloc *)0x0) {
    p_Var2 = local_1d0._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_1d0._M_pi);
      operator_delete(local_1d0._M_pi,0x48);
    }
  }
  Adj::~Adj(&local_90);
  Adj::~Adj(&local_60);
  pvVar6 = extraout_RDX;
  if (((ulong)local_270.shared_alloc_.alloc & 7) == 0 &&
      local_270.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_270.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_270.shared_alloc_.alloc);
      operator_delete(local_270.shared_alloc_.alloc,0x48);
      pvVar6 = extraout_RDX_00;
    }
  }
  if (((ulong)local_1c0 & 7) == 0 && local_1c0 != (Alloc *)0x0) {
    piVar1 = &local_1c0->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1c0);
      operator_delete(local_1c0,0x48);
      pvVar6 = extraout_RDX_01;
    }
  }
  if (((ulong)local_e0 & 7) == 0 && local_e0 != (Alloc *)0x0) {
    piVar1 = &local_e0->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_e0);
      operator_delete(local_e0,0x48);
      pvVar6 = extraout_RDX_02;
    }
  }
  if (((ulong)local_d0 & 7) == 0 && local_d0 != (Alloc *)0x0) {
    piVar1 = &local_d0->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_d0);
      operator_delete(local_d0,0x48);
      pvVar6 = extraout_RDX_03;
    }
  }
  RVar8.write_.shared_alloc_.direct_ptr = pvVar6;
  RVar8.write_.shared_alloc_.alloc = (Alloc *)pMVar4;
  return (Reals)RVar8.write_.shared_alloc_;
}

Assistant:

Reals get_curv_edge_curvatures_dim(Mesh* mesh, LOs curv_edge2edge,
    Reals curv_edge_tangents, LOs curv_vert2vert, Reals curv_vert_tangents) {
  auto vert2curv_vert = invert_injective_map(curv_vert2vert, mesh->nverts());
  auto edge2curv_edge = invert_injective_map(curv_edge2edge, mesh->nedges());
  auto edges2verts = mesh->ask_verts_of(EDGE);
  auto ncurv_edges = curv_edge2edge.size();
  auto curv_edges2curvature_w = Write<Real>(ncurv_edges);
  auto verts2edges = mesh->ask_up(VERT, EDGE);
  auto curv_verts2edges = unmap_adjacency(curv_vert2vert, verts2edges);
  auto ev_flips =
      get_curv_edge_vert_flips(mesh, curv_verts2edges, edge2curv_edge);
  auto coords = mesh->coords();
  auto f = OMEGA_H_LAMBDA(LO curv_edge) {
    auto edge = curv_edge2edge[curv_edge];
    auto et = get_vector<dim>(curv_edge_tangents, curv_edge);
    Few<Vector<dim>, 2> ts;
    auto eev2v = gather_verts<2>(edges2verts, edge);
    for (Int eev = 0; eev < 2; ++eev) {
      auto vert = eev2v[eev];
      auto curv_vert = vert2curv_vert[vert];
      Vector<dim> vt;
      if (curv_vert >= 0) {
        vt = get_vector<dim>(curv_vert_tangents, curv_vert);
        if (ev_flips[edge * 2 + eev]) vt = -vt;
      } else {
        vt = et;
      }
      ts[eev] = vt;
    }
    auto p = gather_vectors<2, dim>(coords, eev2v);
    auto e = p[1] - p[0];
    auto l = norm(e);
    auto u = e / l;
    auto dt = ts[1] - ts[0];
    auto curvature = norm(dt - (u * (dt * u))) / l;
    curv_edges2curvature_w[curv_edge] = curvature;
  };
  parallel_for(ncurv_edges, f, "get_curv_edge_curvatures");
  auto curv_edges2curvature = Reals(curv_edges2curvature_w);
  return mesh->sync_subset_array(
      EDGE, curv_edges2curvature, curv_edge2edge, 0.0, 1);
}